

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O2

void __thiscall
BlockFilterIndex::BlockFilterIndex
          (BlockFilterIndex *this,
          unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> chain,
          BlockFilterType filter_type,size_t n_cache_size,bool f_memory,bool f_wipe)

{
  uint256 *puVar1;
  pointer pcVar2;
  string name;
  base_blob<256U> *pbVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  string *psVar6;
  invalid_argument *this_00;
  pointer *__ptr;
  long in_FS_OFFSET;
  undefined7 local_1a8;
  BlockFilterType filter_type_00;
  undefined6 uStack_1a0;
  bool f_wipe_local;
  bool f_memory_local;
  size_t n_cache_size_local;
  path local_190;
  path local_168;
  path local_140;
  path local_118;
  path local_f0;
  path path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_80;
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1a8 = (undefined7)
              *(undefined8 *)
               chain._M_t.
               super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
               _M_t.
               super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
               super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  filter_type_00 =
       (BlockFilterType)
       ((ulong)*(undefined8 *)
                chain._M_t.
                super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
                _M_t.
                super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl >> 0x38);
  *(undefined8 *)
   chain._M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t
   .super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
   super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl = 0;
  f_memory_local = f_memory;
  n_cache_size_local = n_cache_size;
  psVar6 = BlockFilterTypeName_abi_cxx11_(filter_type_00);
  std::operator+(&local_a0,psVar6," block filter index");
  name._M_dataplus._M_p._7_1_ = filter_type_00;
  name._M_dataplus._M_p._0_7_ = local_1a8;
  name._M_string_length._0_6_ = uStack_1a0;
  name._M_string_length._6_1_ = f_wipe;
  name._M_string_length._7_1_ = f_memory_local;
  name.field_2._M_allocated_capacity = n_cache_size_local;
  name.field_2._8_8_ = local_190._M_pathname._M_dataplus._M_p;
  BaseIndex::BaseIndex
            (&this->super_BaseIndex,
             (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)&local_1a8,name
            );
  std::__cxx11::string::~string((string *)&local_a0);
  if ((long *)CONCAT17(filter_type_00,local_1a8) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT17(filter_type_00,local_1a8) + 8))();
  }
  local_1a8 = 0;
  (this->super_BaseIndex).super_CValidationInterface._vptr_CValidationInterface =
       (_func_int **)&PTR_UpdatedBlockTip_00a16d00;
  this->m_filter_type = filter_type;
  (this->m_db)._M_t.super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t.
  super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
  super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl = (DB *)0x0;
  (this->m_next_filter_pos).nFile = -1;
  *(undefined8 *)&(this->m_next_filter_pos).nPos = 0;
  *(undefined8 *)
   ((long)&(this->m_filter_fileseq)._M_t.
           super___uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>._M_t.
           super__Tuple_impl<0UL,_FlatFileSeq_*,_std::default_delete<FlatFileSeq>_>.
           super__Head_base<0UL,_FlatFileSeq_*,_false>._M_head_impl + 4) = 0;
  *(undefined8 *)((long)&(this->m_cs_headers_cache).super_mutex.super___mutex_base._M_mutex + 4) = 0
  ;
  *(undefined8 *)((long)&(this->m_cs_headers_cache).super_mutex.super___mutex_base._M_mutex + 0xc) =
       0;
  *(undefined4 *)((long)&(this->m_cs_headers_cache).super_mutex.super___mutex_base._M_mutex + 0x24)
       = 0;
  *(undefined8 *)((long)&(this->m_cs_headers_cache).super_mutex.super___mutex_base._M_mutex + 0x14)
       = 0;
  *(undefined8 *)
   ((long)&(this->m_cs_headers_cache).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev +
   4) = 0;
  (this->m_headers_cache)._M_h._M_buckets = &(this->m_headers_cache)._M_h._M_single_bucket;
  (this->m_headers_cache)._M_h._M_bucket_count = 1;
  (this->m_headers_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_headers_cache)._M_h._M_element_count = 0;
  (this->m_headers_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_headers_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_headers_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = &this->m_last_header;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar3 = &(this->m_last_header).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  pbVar3 = &(this->m_last_header).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  pbVar3 = &(this->m_last_header).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  psVar6 = BlockFilterTypeName_abi_cxx11_(BASIC);
  if (psVar6->_M_string_length == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"unknown filter_type");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    goto LAB_003d0ae9;
  }
  ArgsManager::GetDataDirNet((path *)&local_140,&gArgs);
  fs::operator/((path *)&local_118,(path *)&local_140,"indexes");
  fs::operator/((path *)&local_f0,(path *)&local_118,"blockfilter");
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&local_80,pcVar2,pcVar2 + psVar6->_M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            (&local_60,&local_80,auto_format);
  std::filesystem::__cxx11::path::path(&local_168,&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::__cxx11::u8string::~u8string((u8string *)&local_80);
  std::filesystem::__cxx11::path::operator/=(&local_f0,(path *)&local_168);
  std::filesystem::__cxx11::path::path(&path.super_path,&local_f0);
  std::filesystem::__cxx11::path::~path(&local_168);
  std::filesystem::__cxx11::path::~path(&local_f0);
  std::filesystem::__cxx11::path::~path(&local_118);
  std::filesystem::__cxx11::path::~path(&local_140);
  bVar5 = std::filesystem::is_symlink(&path.super_path);
  if (bVar5) {
    bVar5 = std::filesystem::is_directory(&path.super_path);
    if (!bVar5) goto LAB_003d0857;
  }
  else {
LAB_003d0857:
    std::filesystem::create_directories((path *)&path);
  }
  std::filesystem::__cxx11::path::path(&local_190,&path.super_path);
  fs::operator/((path *)&local_60,(path *)&local_190,"db");
  std::make_unique<BaseIndex::DB,fs::path,unsigned_long&,bool&,bool&>
            ((path *)&local_168,(unsigned_long *)&local_60,(bool *)&n_cache_size_local,
             &f_memory_local);
  _Var4._M_p = local_168._M_pathname._M_dataplus._M_p;
  local_168._M_pathname._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::reset
            ((__uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)&this->m_db,
             (pointer)_Var4._M_p);
  std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::~unique_ptr
            ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)&local_168);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::filesystem::__cxx11::path::~path(&local_190);
  std::make_unique<FlatFileSeq,fs::path,char_const(&)[5],unsigned_int_const&>
            ((path *)&local_60,(char (*) [5])&path,(uint *)"fltr");
  _Var4._M_p = local_60._M_pathname._M_dataplus._M_p;
  local_60._M_pathname._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>::reset
            ((__uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_> *)
             &this->m_filter_fileseq,(pointer)_Var4._M_p);
  std::unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_>::~unique_ptr
            ((unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_> *)&local_60);
  std::filesystem::__cxx11::path::~path(&path.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003d0ae9:
  __stack_chk_fail();
}

Assistant:

BlockFilterIndex::BlockFilterIndex(std::unique_ptr<interfaces::Chain> chain, BlockFilterType filter_type,
                                   size_t n_cache_size, bool f_memory, bool f_wipe)
    : BaseIndex(std::move(chain), BlockFilterTypeName(filter_type) + " block filter index")
    , m_filter_type(filter_type)
{
    const std::string& filter_name = BlockFilterTypeName(filter_type);
    if (filter_name.empty()) throw std::invalid_argument("unknown filter_type");

    fs::path path = gArgs.GetDataDirNet() / "indexes" / "blockfilter" / fs::u8path(filter_name);
    fs::create_directories(path);

    m_db = std::make_unique<BaseIndex::DB>(path / "db", n_cache_size, f_memory, f_wipe);
    m_filter_fileseq = std::make_unique<FlatFileSeq>(std::move(path), "fltr", FLTR_FILE_CHUNK_SIZE);
}